

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_342fe3::LaneBasedExecutionQueue::killAfterTimeout(LaneBasedExecutionQueue *this)

{
  char *pcVar1;
  long lVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_18;
  
  local_28._M_device = &this->queueCompleteMutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if (this->queueComplete == false) {
    pcVar1 = getenv("LLBUILD_TEST");
    if (pcVar1 == (char *)0x0) {
      lVar2 = std::chrono::_V2::steady_clock::now();
      local_18.__d.__r = (duration)(lVar2 + 10000000000);
    }
    else {
      lVar2 = std::chrono::_V2::steady_clock::now();
      local_18.__d.__r = (duration)(lVar2 + 1000000000);
    }
    std::condition_variable::
    __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              (&this->queueCompleteCondition,&local_28,&local_18);
    llbuild::basic::ProcessGroup::signalAll(&this->spawnedProcesses,9);
  }
  if (local_28._M_owns == true) {
    std::unique_lock<std::mutex>::unlock(&local_28);
  }
  return;
}

Assistant:

void killAfterTimeout() {
    std::unique_lock<std::mutex> lock(queueCompleteMutex);

    if (!queueComplete) {
      // Shorten timeout if in testing context
      if (getenv("LLBUILD_TEST") != nullptr) {
        queueCompleteCondition.wait_for(lock, std::chrono::milliseconds(1000));
      } else {
        queueCompleteCondition.wait_for(lock, std::chrono::seconds(10));
      }

#if _WIN32
      spawnedProcesses.signalAll(SIGTERM);
#else
      spawnedProcesses.signalAll(SIGKILL);
#endif
    }
  }